

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
cmExportInstallFileGenerator::FindNamespaces
          (pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,cmExportInstallFileGenerator *this,cmGlobalGenerator *gg,
          string *name)

{
  bool bVar1;
  bool bVar2;
  __type _Var3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
  *this_00;
  reference ppVar4;
  vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
  *this_01;
  reference this_02;
  pointer __rhs;
  vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
  *this_03;
  reference ppcVar5;
  string *psVar6;
  string local_110;
  cmInstallExportGenerator *local_f0;
  cmInstallExportGenerator *install;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
  *__range3;
  vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
  *installs;
  unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *target;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
  *__range2;
  bool containsTarget;
  cmExportSet *exportSet;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>
  *expIt;
  const_iterator __end1;
  const_iterator __begin1;
  cmExportSetMap *__range1;
  cmExportSetMap *exportSets;
  string ns;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exportFiles;
  string *name_local;
  cmGlobalGenerator *gg_local;
  cmExportInstallFileGenerator *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&ns.field_2 + 8));
  std::__cxx11::string::string((string *)&exportSets);
  this_00 = &cmGlobalGenerator::GetExportSets(gg)->
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
  ;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
           ::begin(this_00);
  expIt = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
             ::end(this_00);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&expIt);
    if (!bVar1) {
      std::
      pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (__return_storage_ptr__,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&ns.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exportSets);
      std::__cxx11::string::~string((string *)&exportSets);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&ns.field_2 + 8));
      return __return_storage_ptr__;
    }
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>
             ::operator*(&__end1);
    bVar1 = false;
    this_01 = cmExportSet::GetTargetExports(&ppVar4->second);
    __end2 = std::
             vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
             ::begin(this_01);
    target = (unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *)
             std::
             vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
             ::end(this_01);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
                                       *)&target), bVar2) {
      this_02 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
                ::operator*(&__end2);
      __rhs = std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>::operator->
                        (this_02);
      _Var3 = std::operator==(name,&__rhs->TargetName);
      if (_Var3) {
        bVar1 = true;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
      ::operator++(&__end2);
    }
    if (bVar1) {
      this_03 = cmExportSet::GetInstallations(&ppVar4->second);
      __end3 = std::
               vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
               ::begin(this_03);
      install = (cmInstallExportGenerator *)
                std::
                vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
                ::end(this_03);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_cmInstallExportGenerator_*const_*,_std::vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>_>
                                         *)&install), bVar1) {
        ppcVar5 = __gnu_cxx::
                  __normal_iterator<const_cmInstallExportGenerator_*const_*,_std::vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>_>
                  ::operator*(&__end3);
        local_f0 = *ppcVar5;
        cmInstallExportGenerator::GetDestinationFile_abi_cxx11_(&local_110,local_f0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&ns.field_2 + 8),&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        psVar6 = cmInstallExportGenerator::GetNamespace_abi_cxx11_(local_f0);
        std::__cxx11::string::operator=((string *)&exportSets,(string *)psVar6);
        __gnu_cxx::
        __normal_iterator<const_cmInstallExportGenerator_*const_*,_std::vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>_>
        ::operator++(&__end3);
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

std::pair<std::vector<std::string>, std::string>
cmExportInstallFileGenerator::FindNamespaces(cmGlobalGenerator* gg,
                                             const std::string& name)
{
  std::vector<std::string> exportFiles;
  std::string ns;
  const cmExportSetMap& exportSets = gg->GetExportSets();

  for (auto const& expIt : exportSets) {
    const cmExportSet& exportSet = expIt.second;

    bool containsTarget = false;
    for (auto const& target : exportSet.GetTargetExports()) {
      if (name == target->TargetName) {
        containsTarget = true;
        break;
      }
    }

    if (containsTarget) {
      std::vector<cmInstallExportGenerator const*> const* installs =
        exportSet.GetInstallations();
      for (cmInstallExportGenerator const* install : *installs) {
        exportFiles.push_back(install->GetDestinationFile());
        ns = install->GetNamespace();
      }
    }
  }

  return { exportFiles, ns };
}